

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::Scrollbar(ImGuiLayoutType direction)

{
  bool bVar1;
  ImGuiID IVar2;
  ImGuiWindow *this;
  ImDrawList *this_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [12];
  ulong uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ImVec2 IVar8;
  undefined1 auVar9 [16];
  ImGuiContext *pIVar10;
  ImGuiContext *pIVar11;
  ImU32 IVar12;
  ImVec2 *pIVar13;
  ImGuiContext *g;
  undefined4 extraout_EDX;
  char *str;
  ImRect *pIVar14;
  int iVar15;
  uint uVar16;
  int iVar20;
  float fVar21;
  int iVar22;
  int iVar23;
  undefined1 auVar18 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  undefined1 auVar32 [16];
  float fVar33;
  float fVar34;
  float fVar35;
  bool hovered;
  bool held;
  bool local_d9;
  undefined1 local_d8 [8];
  ImVec2 IStack_d0;
  bool local_c1;
  float local_c0;
  float local_bc;
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [12];
  float fStack_6c;
  ImVec2 *local_68;
  ImVec2 *local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  
  pIVar10 = GImGui;
  local_88._8_8_ = local_88._0_8_;
  this = GImGui->CurrentWindow;
  str = "#SCROLLY";
  if (direction == 1) {
    str = "#SCROLLX";
  }
  local_b8._0_4_ = ImGuiWindow::GetID(this,str,(char *)0x0);
  bVar1 = (&this->ScrollbarX)[direction == 1];
  local_a8 = 0.0;
  if (bVar1 == true) {
    local_a8 = (pIVar10->Style).ScrollbarSize;
  }
  local_d8._0_4_ = (this->Pos).x;
  fVar33 = (this->Pos).y;
  local_bc = (this->Size).x + (float)local_d8._0_4_;
  local_c0 = (this->Size).y + fVar33;
  fVar21 = this->WindowBorderSize;
  if (direction == 1) {
    local_d8._0_4_ = (float)local_d8._0_4_ + fVar21;
    local_d8._4_4_ = local_c0 - (pIVar10->Style).ScrollbarSize;
    IStack_d0.y = local_c0;
    IStack_d0.x = local_bc - local_a8;
  }
  else {
    local_d8._0_4_ = local_bc - (pIVar10->Style).ScrollbarSize;
    IStack_d0.y = local_c0 - local_a8;
    fVar28 = 0.0;
    fVar35 = 0.0;
    if ((this->Flags & 1U) == 0) {
      fVar35 = (GImGui->Style).FramePadding.y;
      fVar35 = fVar35 + fVar35 + GImGui->FontBaseSize * this->FontWindowScale;
    }
    if (((uint)this->Flags >> 10 & 1) != 0) {
      fVar28 = (GImGui->Style).FramePadding.y;
      fVar28 = fVar28 + fVar28 +
               GImGui->FontBaseSize * this->FontWindowScale + (this->DC).MenuBarOffset.y;
    }
    local_d8._4_4_ = fVar33 + fVar21 + fVar35 + fVar28;
    IStack_d0.x = local_bc;
  }
  IStack_d0.x = IStack_d0.x - fVar21;
  IStack_d0.y = IStack_d0.y - fVar21;
  if (IStack_d0.x - (float)local_d8._0_4_ <= 0.0) {
    return;
  }
  if (IStack_d0.y - (float)local_d8._4_4_ <= 0.0) {
    return;
  }
  if (direction == 1) {
    iVar15 = (uint)(bVar1 ^ 1) * 8 + 4;
    local_98 = 4.48416e-44;
    local_88._0_8_ = 0x30;
  }
  else {
    iVar15 = ((uint)~this->Flags >> 9 & -(this->Flags & 1U) & 2) + (uint)(bVar1 ^ 1) * 8;
    local_98 = 5.04467e-44;
    local_88._0_8_ = 0x34;
  }
  fStack_94 = 0.0;
  this_00 = this->DrawList;
  local_78._0_8_ = *(ImVec2 *)((GImGui->Style).Colors + 0xe);
  uVar6 = (GImGui->Style).Colors[0xe].z;
  uVar7 = (GImGui->Style).Colors[0xe].w;
  fStack_6c = (GImGui->Style).Alpha * (float)uVar7;
  local_78._8_4_ = uVar6;
  IVar12 = ColorConvertFloat4ToU32((ImVec4 *)local_78);
  ImDrawList::AddRectFilled
            (this_00,(ImVec2 *)local_d8,&IStack_d0,IVar12,this->WindowRounding,iVar15);
  iVar15 = (int)(((IStack_d0.x - (float)local_d8._0_4_) + -2.0) * 0.5);
  iVar20 = (int)(((IStack_d0.y - (float)local_d8._4_4_) + -2.0) * 0.5);
  iVar22 = (int)(((IStack_d0.x - IStack_d0.x) + 0.0) * 0.0);
  iVar23 = (int)(((IStack_d0.y - IStack_d0.y) + 0.0) * 0.0);
  auVar29._0_4_ = -(uint)(iVar15 < 0);
  auVar29._4_4_ = -(uint)(iVar20 < 0);
  auVar29._8_4_ = -(uint)(iVar22 < 0);
  auVar29._12_4_ = -(uint)(iVar23 < 0);
  auVar30._0_4_ = -(uint)(3 < iVar15);
  auVar30._4_4_ = -(uint)(3 < iVar20);
  auVar30._8_4_ = -(uint)(0 < iVar22);
  auVar30._12_4_ = -(uint)(0 < iVar23);
  auVar24._0_8_ = CONCAT44((float)iVar20,(float)iVar15) ^ 0x8000000080000000;
  auVar24._8_4_ = -(float)iVar22;
  auVar24._12_4_ = -(float)iVar23;
  auVar30 = auVar29 & _DAT_001da5d0 | ~auVar29 & (auVar30 & _DAT_001da5c0 | ~auVar30 & auVar24);
  fStack_a0 = auVar30._0_4_;
  fVar33 = auVar30._4_4_;
  auVar25._0_8_ = auVar30._0_8_;
  auVar25._8_4_ = fStack_a0;
  auVar25._12_4_ = fVar33;
  local_d8._0_4_ = (float)local_d8._0_4_ - fStack_a0;
  fVar21 = (float)local_d8._4_4_ - fVar33;
  fStack_a0 = IStack_d0.x + fStack_a0;
  fStack_a4 = IStack_d0.y + fVar33;
  auVar4._4_8_ = auVar25._8_8_;
  auVar4._0_4_ = (float)local_d8._4_4_ + fVar33;
  auVar26._0_8_ = auVar4._0_8_ << 0x20;
  auVar26._8_4_ = fStack_a0;
  auVar26._12_4_ = fStack_a4;
  IStack_d0 = auVar26._8_8_;
  fVar33 = (float)local_d8._0_4_;
  if (direction != 1) {
    fStack_a0 = fStack_a4;
    fVar33 = fVar21;
  }
  fVar33 = fStack_a0 - fVar33;
  fVar28 = *(float *)((long)&this->Name + CONCAT44(fStack_94,local_98)) - local_a8;
  local_48 = ZEXT416((uint)fVar28);
  fVar35 = *(float *)((long)&this->Name + local_88._0_8_);
  local_88 = ZEXT416((uint)fVar35);
  fVar35 = (float)(~-(uint)(fVar28 <= fVar35) & (uint)fVar28 |
                  -(uint)(fVar28 <= fVar35) & (uint)fVar35);
  local_d8._4_4_ = fVar21;
  if (fVar35 <= 0.0) {
    __assert_fail("ImMax(win_size_contents_v, win_size_avail_v) > 0.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x1939,"void ImGui::Scrollbar(ImGuiLayoutType)");
  }
  local_60 = &this->Scroll;
  local_68 = (ImVec2 *)&(this->Scroll).y;
  pIVar13 = local_68;
  if (direction == 1) {
    pIVar13 = local_60;
  }
  if (fVar35 <= 1.0) {
    fVar35 = 1.0;
  }
  fVar28 = (fVar28 / fVar35) * fVar33;
  fVar21 = (pIVar10->Style).GrabMinSize;
  fVar35 = fVar33;
  if (fVar28 <= fVar33) {
    fVar35 = fVar28;
  }
  uVar16 = -(uint)(fVar28 < fVar21);
  local_a8 = (float)(uVar16 & (uint)fVar21 | ~uVar16 & (uint)fVar35);
  local_58 = ZEXT416((uint)pIVar13->x);
  local_c1 = false;
  local_d9 = false;
  IVar2 = pIVar10->ActiveId;
  fStack_9c = fStack_a4;
  local_98 = fVar33;
  fStack_94 = fStack_a4;
  fStack_90 = fStack_a0;
  fStack_8c = fStack_a4;
  ButtonBehavior((ImRect *)local_d8,local_b8._0_4_,&local_d9,&local_c1,0x2000);
  pIVar11 = GImGui;
  auVar9._4_4_ = fStack_94;
  auVar9._0_4_ = local_98;
  auVar9._8_4_ = fStack_90;
  auVar9._12_4_ = fStack_8c;
  fVar33 = 1.0;
  if (1.0 <= (float)local_88._0_4_ - (float)local_48._0_4_) {
    fVar33 = (float)local_88._0_4_ - (float)local_48._0_4_;
  }
  auVar18._4_4_ = fStack_a4;
  auVar18._0_4_ = local_a8;
  auVar27._4_12_ = auVar9._4_12_;
  auVar18._8_4_ = fStack_a4;
  auVar18._12_4_ = fStack_9c;
  auVar17._8_8_ = auVar18._8_8_;
  auVar17._4_4_ = local_58._0_4_;
  auVar17._0_4_ = local_a8;
  auVar19._0_12_ = auVar17._0_12_;
  auVar19._12_4_ = local_58._4_4_;
  auVar32._4_4_ = fVar33;
  auVar32._0_4_ = local_98;
  auVar32._8_4_ = fStack_94;
  auVar32._12_4_ = 0;
  auVar30 = divps(auVar19,auVar32);
  fVar35 = auVar30._0_4_;
  fVar28 = auVar30._4_4_;
  auVar3._4_4_ = -(uint)(fVar35 < 1.0);
  auVar3._0_4_ = -(uint)(fVar35 < 1.0);
  auVar3._8_4_ = -(uint)(fVar28 < 0.0);
  auVar3._12_4_ = -(uint)(fVar28 < 0.0);
  uVar16 = movmskpd(extraout_EDX,auVar3);
  fVar21 = 0.0;
  if (((uVar16 & 2) == 0) && (fVar21 = 1.0, fVar28 <= 1.0)) {
    fVar21 = fVar28;
  }
  fVar21 = (fVar21 * (local_98 - local_a8)) / local_98;
  if (((byte)uVar16 & local_c1) != 1) {
    local_b8 = ZEXT416((uint)fVar21);
    goto LAB_00181f27;
  }
  pIVar14 = (ImRect *)(local_d8 + 4);
  if (direction == 1) {
    pIVar14 = (ImRect *)local_d8;
  }
  uVar5 = (ulong)(direction != 1);
  fVar31 = (*(float *)((pIVar10->IO).MouseDown + uVar5 * 4 + -8) - (pIVar14->Min).x) / local_98;
  fVar28 = 1.0;
  if (fVar31 <= 1.0) {
    fVar28 = fVar31;
  }
  fVar34 = 0.0;
  fVar28 = (float)(~-(uint)(fVar31 < 0.0) & (uint)fVar28);
  GImGui->HoveredId = local_b8._0_4_;
  pIVar11->HoveredIdAllowOverlap = false;
  if ((local_b8._0_4_ != 0) && (pIVar11->HoveredIdPreviousFrame == local_b8._0_4_)) {
    fVar34 = pIVar11->HoveredIdTimer + (pIVar11->IO).DeltaTime;
  }
  pIVar11->HoveredIdTimer = fVar34;
  if (IVar2 == local_b8._0_4_) {
    fVar21 = (&(pIVar10->ScrollbarClickDeltaToGrabCenter).x)[uVar5];
LAB_00181e6d:
    bVar1 = false;
  }
  else {
    if ((fVar21 <= fVar28) && (fVar28 <= fVar35 + fVar21)) {
      fVar21 = fVar35 * -0.5 + (fVar28 - fVar21);
      (&(pIVar10->ScrollbarClickDeltaToGrabCenter).x)[uVar5] = fVar21;
      goto LAB_00181e6d;
    }
    (&(pIVar10->ScrollbarClickDeltaToGrabCenter).x)[uVar5] = 0.0;
    bVar1 = true;
    fVar21 = 0.0;
  }
  fVar31 = ((fVar28 - fVar21) - fVar35 * 0.5) / (1.0 - fVar35);
  fVar21 = 1.0;
  if (fVar31 <= 1.0) {
    fVar21 = fVar31;
  }
  fVar21 = (float)(int)((float)(~-(uint)(fVar31 < 0.0) & (uint)fVar21) * fVar33 + 0.5);
  pIVar13 = local_68;
  if (direction == 1) {
    pIVar13 = local_60;
  }
  pIVar13->x = fVar21;
  fVar21 = fVar21 / fVar33;
  fVar33 = 1.0;
  if (fVar21 <= 1.0) {
    fVar33 = fVar21;
  }
  auVar27._0_4_ =
       ((local_98 - local_a8) * (float)(~-(uint)(fVar21 < 0.0) & (uint)fVar33)) / local_98;
  local_b8 = auVar27;
  if (bVar1) {
    (&(pIVar10->ScrollbarClickDeltaToGrabCenter).x)[uVar5] =
         -fVar35 * 0.5 + (fVar28 - auVar27._0_4_);
  }
LAB_00181f27:
  iVar15 = 0x11;
  if (local_c1 == false) {
    iVar15 = (local_d9 & 1) + 0xf;
  }
  pIVar13 = (ImVec2 *)((long)&(pIVar11->Style).Colors[0].x + (ulong)(uint)(iVar15 << 4));
  local_78._0_8_ = *pIVar13;
  IVar8 = pIVar13[1];
  fStack_6c = IVar8.y;
  local_78._8_4_ = IVar8.x;
  fStack_6c = (pIVar11->Style).Alpha * fStack_6c;
  IVar12 = ColorConvertFloat4ToU32((ImVec4 *)local_78);
  if (direction == 1) {
    local_78._0_4_ =
         (float)local_d8._0_4_ + (IStack_d0.x - (float)local_d8._0_4_) * (float)local_b8._0_4_;
    local_78._8_4_ = local_a8 + (float)local_78._0_4_;
    local_78._4_4_ = local_d8._4_4_;
    fStack_6c = IStack_d0.y;
    if (local_bc <= (float)local_78._8_4_) {
      local_78._8_4_ = local_bc;
    }
  }
  else {
    local_78._4_4_ =
         (IStack_d0.y - (float)local_d8._4_4_) * (float)local_b8._0_4_ + (float)local_d8._4_4_;
    local_78._8_4_ = IStack_d0.x;
    local_78._0_4_ = local_d8._0_4_;
    fStack_6c = local_a8 + (float)local_78._4_4_;
    if (local_c0 <= local_a8 + (float)local_78._4_4_) {
      fStack_6c = local_c0;
    }
  }
  ImDrawList::AddRectFilled
            (this->DrawList,(ImVec2 *)local_78,(ImVec2 *)(local_78 + 8),IVar12,
             (pIVar10->Style).ScrollbarRounding,0xf);
  return;
}

Assistant:

void ImGui::Scrollbar(ImGuiLayoutType direction)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const bool horizontal = (direction == ImGuiLayoutType_Horizontal);
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(horizontal ? "#SCROLLX" : "#SCROLLY");

    // Render background
    bool other_scrollbar = (horizontal ? window->ScrollbarY : window->ScrollbarX);
    float other_scrollbar_size_w = other_scrollbar ? style.ScrollbarSize : 0.0f;
    const ImRect window_rect = window->Rect();
    const float border_size = window->WindowBorderSize;
    ImRect bb = horizontal
        ? ImRect(window->Pos.x + border_size, window_rect.Max.y - style.ScrollbarSize, window_rect.Max.x - other_scrollbar_size_w - border_size, window_rect.Max.y - border_size)
        : ImRect(window_rect.Max.x - style.ScrollbarSize, window->Pos.y + border_size, window_rect.Max.x - border_size, window_rect.Max.y - other_scrollbar_size_w - border_size);
    if (!horizontal)
        bb.Min.y += window->TitleBarHeight() + ((window->Flags & ImGuiWindowFlags_MenuBar) ? window->MenuBarHeight() : 0.0f);
    if (bb.GetWidth() <= 0.0f || bb.GetHeight() <= 0.0f)
        return;

    int window_rounding_corners;
    if (horizontal)
        window_rounding_corners = ImDrawCornerFlags_BotLeft | (other_scrollbar ? 0 : ImDrawCornerFlags_BotRight);
    else
        window_rounding_corners = (((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar)) ? ImDrawCornerFlags_TopRight : 0) | (other_scrollbar ? 0 : ImDrawCornerFlags_BotRight);
    window->DrawList->AddRectFilled(bb.Min, bb.Max, GetColorU32(ImGuiCol_ScrollbarBg), window->WindowRounding, window_rounding_corners);
    bb.Expand(ImVec2(-ImClamp((float)(int)((bb.Max.x - bb.Min.x - 2.0f) * 0.5f), 0.0f, 3.0f), -ImClamp((float)(int)((bb.Max.y - bb.Min.y - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main, longer axis of the scrollbar (= height for a vertical scrollbar)
    float scrollbar_size_v = horizontal ? bb.GetWidth() : bb.GetHeight();
    float scroll_v = horizontal ? window->Scroll.x : window->Scroll.y;
    float win_size_avail_v = (horizontal ? window->SizeFull.x : window->SizeFull.y) - other_scrollbar_size_w;
    float win_size_contents_v = horizontal ? window->SizeContents.x : window->SizeContents.y;

    // Calculate the height of our grabbable box. It generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    IM_ASSERT(ImMax(win_size_contents_v, win_size_avail_v) > 0.0f); // Adding this assert to check if the ImMax(XXX,1.0f) is still needed. PLEASE CONTACT ME if this triggers.
    const float win_size_v = ImMax(ImMax(win_size_contents_v, win_size_avail_v), 1.0f);
    const float grab_h_pixels = ImClamp(scrollbar_size_v * (win_size_avail_v / win_size_v), style.GrabMinSize, scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    const bool previously_held = (g.ActiveId == id);
    ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_NoNavFocus);

    float scroll_max = ImMax(1.0f, win_size_contents_v - win_size_avail_v);
    float scroll_ratio = ImSaturate(scroll_v / scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;
    if (held && grab_h_norm < 1.0f)
    {
        float scrollbar_pos_v = horizontal ? bb.Min.x : bb.Min.y;
        float mouse_pos_v = horizontal ? g.IO.MousePos.x : g.IO.MousePos.y;
        float* click_delta_to_grab_center_v = horizontal ? &g.ScrollbarClickDeltaToGrabCenter.x : &g.ScrollbarClickDeltaToGrabCenter.y;

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);
        SetHoveredID(id);

        bool seek_absolute = false;
        if (!previously_held)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            if (clicked_v_norm >= grab_v_norm && clicked_v_norm <= grab_v_norm + grab_h_norm)
            {
                *click_delta_to_grab_center_v = clicked_v_norm - grab_v_norm - grab_h_norm*0.5f;
            }
            else
            {
                seek_absolute = true;
                *click_delta_to_grab_center_v = 0.0f;
            }
        }

        // Apply scroll
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of SizeContents and before setting up our starting position
        const float scroll_v_norm = ImSaturate((clicked_v_norm - *click_delta_to_grab_center_v - grab_h_norm*0.5f) / (1.0f - grab_h_norm));
        scroll_v = (float)(int)(0.5f + scroll_v_norm * scroll_max);//(win_size_contents_v - win_size_v));
        if (horizontal)
            window->Scroll.x = scroll_v;
        else
            window->Scroll.y = scroll_v;

        // Update values for rendering
        scroll_ratio = ImSaturate(scroll_v / scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seeked and saturated
        if (seek_absolute)
            *click_delta_to_grab_center_v = clicked_v_norm - grab_v_norm - grab_h_norm*0.5f;
    }

    // Render
    const ImU32 grab_col = GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab);
    ImRect grab_rect;
    if (horizontal)
        grab_rect = ImRect(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y, ImMin(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, window_rect.Max.x), bb.Max.y);
    else
        grab_rect = ImRect(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm), bb.Max.x, ImMin(ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels, window_rect.Max.y));
    window->DrawList->AddRectFilled(grab_rect.Min, grab_rect.Max, grab_col, style.ScrollbarRounding);
}